

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_quantization(CommonQuantParams *quant_params,int num_planes,_Bool separate_uv_delta_q,
                       aom_read_bit_buffer *rb)

{
  int iVar1;
  aom_read_bit_buffer *in_RCX;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  int diff_uv_delta;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  *in_RDI = iVar1;
  iVar1 = read_delta_q((aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  in_RDI[2] = iVar1;
  if (in_ESI < 2) {
    in_RDI[3] = 0;
    in_RDI[5] = 0;
    in_RDI[4] = 0;
    in_RDI[6] = 0;
  }
  else {
    in_stack_ffffffffffffffe4 = 0;
    if ((in_DL & 1) != 0) {
      in_stack_ffffffffffffffe4 = aom_rb_read_bit(in_RCX);
    }
    iVar1 = read_delta_q((aom_read_bit_buffer *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI[3] = iVar1;
    iVar1 = read_delta_q((aom_read_bit_buffer *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI[5] = iVar1;
    if (in_stack_ffffffffffffffe4 == 0) {
      in_RDI[4] = in_RDI[3];
      in_RDI[6] = in_RDI[5];
    }
    else {
      iVar1 = read_delta_q((aom_read_bit_buffer *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_RDI[4] = iVar1;
      iVar1 = read_delta_q((aom_read_bit_buffer *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_RDI[6] = iVar1;
    }
  }
  iVar1 = aom_rb_read_bit(in_RCX);
  *(bool *)(in_RDI + 0x11f0) = iVar1 != 0;
  if ((*(byte *)(in_RDI + 0x11f0) & 1) == 0) {
    in_RDI[0x11f1] = 0;
    in_RDI[0x11f2] = 0;
    in_RDI[0x11f3] = 0;
  }
  else {
    iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    in_RDI[0x11f1] = iVar1;
    iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    in_RDI[0x11f2] = iVar1;
    if ((in_DL & 1) == 0) {
      in_RDI[0x11f3] = in_RDI[0x11f2];
    }
    else {
      iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc);
      in_RDI[0x11f3] = iVar1;
    }
  }
  return;
}

Assistant:

static inline void setup_quantization(CommonQuantParams *quant_params,
                                      int num_planes, bool separate_uv_delta_q,
                                      struct aom_read_bit_buffer *rb) {
  quant_params->base_qindex = aom_rb_read_literal(rb, QINDEX_BITS);
  quant_params->y_dc_delta_q = read_delta_q(rb);
  if (num_planes > 1) {
    int diff_uv_delta = 0;
    if (separate_uv_delta_q) diff_uv_delta = aom_rb_read_bit(rb);
    quant_params->u_dc_delta_q = read_delta_q(rb);
    quant_params->u_ac_delta_q = read_delta_q(rb);
    if (diff_uv_delta) {
      quant_params->v_dc_delta_q = read_delta_q(rb);
      quant_params->v_ac_delta_q = read_delta_q(rb);
    } else {
      quant_params->v_dc_delta_q = quant_params->u_dc_delta_q;
      quant_params->v_ac_delta_q = quant_params->u_ac_delta_q;
    }
  } else {
    quant_params->u_dc_delta_q = 0;
    quant_params->u_ac_delta_q = 0;
    quant_params->v_dc_delta_q = 0;
    quant_params->v_ac_delta_q = 0;
  }
  quant_params->using_qmatrix = aom_rb_read_bit(rb);
  if (quant_params->using_qmatrix) {
    quant_params->qmatrix_level_y = aom_rb_read_literal(rb, QM_LEVEL_BITS);
    quant_params->qmatrix_level_u = aom_rb_read_literal(rb, QM_LEVEL_BITS);
    if (!separate_uv_delta_q)
      quant_params->qmatrix_level_v = quant_params->qmatrix_level_u;
    else
      quant_params->qmatrix_level_v = aom_rb_read_literal(rb, QM_LEVEL_BITS);
  } else {
    quant_params->qmatrix_level_y = 0;
    quant_params->qmatrix_level_u = 0;
    quant_params->qmatrix_level_v = 0;
  }
}